

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KLV.cpp
# Opt level: O3

KLVFilePacket * __thiscall
ASDCP::KLVFilePacket::InitFromFile(KLVFilePacket *this,IFileReader *Reader,UL *label)

{
  bool bVar1;
  UL *in_RCX;
  undefined1 *puVar2;
  UL local_38;
  
  InitFromFile(this,Reader);
  if (-1 < *(int *)&(this->super_KLVPacket)._vptr_KLVPacket) {
    local_38.super_Identifier<16U>.m_HasValue = true;
    local_38.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)*(byte_t **)(Reader + 8);
    local_38.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(*(byte_t **)(Reader + 8) + 8);
    local_38.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0021d318;
    bVar1 = UL::operator==(&local_38,in_RCX);
    puVar2 = Kumu::RESULT_FAIL;
    if (bVar1) {
      puVar2 = Kumu::RESULT_OK;
    }
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)puVar2);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::KLVFilePacket::InitFromFile(const Kumu::IFileReader& Reader, const UL& label)
{
  Result_t result = KLVFilePacket::InitFromFile(Reader);

  if ( ASDCP_SUCCESS(result) )
    result = ( UL(m_KeyStart) == label ) ? RESULT_OK : RESULT_FAIL;

  return result;
}